

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O0

QPropertyBindingData * __thiscall
QBindingStoragePrivate::get(QBindingStoragePrivate *this,QUntypedPropertyData *data,bool create)

{
  size_t sVar1;
  Pair *pPVar2;
  byte in_DL;
  QUntypedPropertyData *in_RSI;
  undefined8 *in_RDI;
  size_t in_stack_00000008;
  QBindingStoragePrivate *in_stack_00000010;
  Pair *p;
  size_t index;
  size_t in_stack_ffffffffffffffb8;
  QUntypedPropertyData *in_stack_ffffffffffffffc0;
  QPropertyBindingData *this_00;
  ulong local_28;
  QPropertyBindingData *local_8;
  
  if (*(long *)*in_RDI == 0) {
    if ((in_DL & 1) == 0) {
      return (QPropertyBindingData *)0x0;
    }
    reallocate(in_stack_00000010,in_stack_00000008);
  }
  else if (**(ulong **)*in_RDI <= (ulong)(*(long *)(*(long *)*in_RDI + 8) << 1)) {
    reallocate(in_stack_00000010,in_stack_00000008);
  }
  sVar1 = qHash<QUntypedPropertyData>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_28 = sVar1 & **(long **)*in_RDI - 1U;
  pPVar2 = pairs(*(QBindingStorageData **)*in_RDI);
  while( true ) {
    if (pPVar2[local_28].data == (QUntypedPropertyData *)0x0) {
      if ((in_DL & 1) == 0) {
        local_8 = (QPropertyBindingData *)0x0;
      }
      else {
        *(long *)(*(long *)*in_RDI + 8) = *(long *)(*(long *)*in_RDI + 8) + 1;
        pPVar2[local_28].data = in_RSI;
        this_00 = &pPVar2[local_28].bindingData;
        memset(this_00,0,8);
        QtPrivate::QPropertyBindingData::QPropertyBindingData(this_00);
        local_8 = &pPVar2[local_28].bindingData;
      }
      return local_8;
    }
    if (pPVar2[local_28].data == in_RSI) break;
    local_28 = local_28 + 1;
    if (local_28 == **(ulong **)*in_RDI) {
      local_28 = 0;
    }
  }
  return &pPVar2[local_28].bindingData;
}

Assistant:

QPropertyBindingData *get(QUntypedPropertyData *data, bool create)
    {
        if (!d) {
            if (!create)
                return nullptr;
            reallocate(8);
        }
        else if (d->used*2 >= d->size)
            reallocate(d->size*2);
        Q_ASSERT(d->size && (d->size & (d->size - 1)) == 0); // size is a power of two
        size_t index = qHash(data) & (d->size - 1);
        Pair *p = pairs(d);
        while (p[index].data) {
            if (p[index].data == data)
                return &p[index].bindingData;
            ++index;
            if (index == d->size)
                index = 0;
        }
        if (!create)
            return nullptr;
        ++d->used;
        new (p + index) Pair{data, QPropertyBindingData()};
        return &p[index].bindingData;
    }